

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast_force
              (char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  uint uVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  BYTE *s;
  int *piVar7;
  long *plVar8;
  char *pcVar9;
  long *plVar10;
  long *plVar11;
  ulong uVar12;
  long *plVar13;
  ulong uVar14;
  BYTE *d_1;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  BYTE *d;
  BYTE *e;
  long *plVar18;
  int *piVar19;
  LZ4_stream_t ctx;
  long *local_40a8;
  long *local_40a0;
  uint local_4050 [4104];
  
  iVar4 = 0;
  memset(local_4050,0,0x4020);
  pcVar16 = dest + maxOutputSize;
  if (inputSize < 0x1000b) {
    iVar4 = 0;
    if ((uint)inputSize < 0x7e000001) {
      local_40a8 = (long *)source;
      plVar11 = (long *)dest;
      if (0xc < inputSize) {
        *(undefined2 *)
         ((long)local_4050 +
         (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1b) & 0x1fff) * 2) = 0;
        plVar10 = (long *)(source + 1);
        uVar15 = (uint)((ulong)(*(long *)(source + 1) * 0xcf1bbcdcbb) >> 0x1b) & 0x1fff;
        plVar13 = (long *)dest;
        piVar19 = (int *)dest;
        do {
          uVar14 = 1;
          uVar3 = acceleration << 6;
          do {
            plVar18 = plVar10;
            plVar10 = (long *)(uVar14 + (long)plVar18);
            sVar2 = (short)source;
            if (source + (long)inputSize + -0xc < plVar10) {
              iVar4 = 3;
              goto LAB_00151e7f;
            }
            uVar14 = (ulong)uVar15;
            piVar19 = (int *)(source + *(ushort *)((long)local_4050 + uVar14 * 2));
            uVar15 = (uint)((ulong)(*plVar10 * 0xcf1bbcdcbb) >> 0x1b) & 0x1fff;
            *(short *)((long)local_4050 + uVar14 * 2) = (short)plVar18 - sVar2;
            uVar14 = (ulong)(uVar3 >> 6);
            uVar3 = uVar3 + 1;
          } while (*piVar19 != (int)*plVar18);
          iVar4 = 0;
LAB_00151e7f:
          plVar10 = plVar18;
          plVar11 = plVar13;
          if (iVar4 == 0) {
            if ((local_40a8 < plVar18) && (source < piVar19)) {
              while( true ) {
                plVar11 = (long *)((long)plVar18 + -1);
                piVar7 = (int *)((long)piVar19 + -1);
                plVar10 = plVar18;
                if (*(char *)plVar11 != *(char *)piVar7) break;
                plVar10 = plVar11;
                piVar19 = piVar7;
                if ((plVar11 <= local_40a8) || (plVar18 = plVar11, piVar7 <= source)) break;
              }
            }
            uVar14 = (long)plVar10 - (long)local_40a8;
            plVar11 = (long *)((long)plVar13 + 1);
            uVar12 = uVar14 & 0xffffffff;
            pcVar17 = (char *)((long)plVar13 + uVar12 / 0xff + uVar12 + 9);
            if (pcVar17 <= pcVar16) {
              if ((uint)uVar14 < 0xf) {
                *(char *)plVar13 = (char)uVar14 << 4;
                plVar18 = plVar11;
              }
              else {
                iVar4 = (uint)uVar14 - 0xf;
                *(char *)plVar13 = -0x10;
                if (0xfe < iVar4) {
                  if (0x1fc < iVar4) {
                    iVar4 = 0x1fd;
                  }
                  uVar3 = ((int)plVar10 - (iVar4 + (int)local_40a8)) + 0xef;
                  memset(plVar11,0xff,(ulong)(uVar3 / 0xff + 1));
                  plVar11 = (long *)((long)plVar13 + (ulong)uVar3 / 0xff + 2);
                  iVar4 = ((int)plVar10 - (int)local_40a8) + uVar3 / 0xff + -0x10e;
                }
                *(char *)plVar11 = (char)iVar4;
                plVar18 = (long *)((long)plVar11 + 1);
              }
              plVar11 = (long *)(uVar12 + (long)plVar18);
              plVar8 = local_40a8;
              do {
                *plVar18 = *plVar8;
                plVar18 = plVar18 + 1;
                plVar8 = plVar8 + 1;
              } while (plVar18 < plVar11);
            }
            iVar4 = 1;
            if (pcVar17 <= pcVar16) {
              while( true ) {
                *(short *)plVar11 = (short)plVar10 - (short)piVar19;
                plVar18 = (long *)((long)plVar11 + 2);
                uVar3 = LZ4_count((BYTE *)((long)plVar10 + 4),(BYTE *)(piVar19 + 1),
                                  (BYTE *)(source + (long)inputSize + -5));
                pcVar17 = (char *)((long)plVar11 + (ulong)(uVar3 >> 8) + 8);
                if (pcVar17 <= pcVar16) {
                  if (uVar3 < 0xf) {
                    *(char *)plVar13 = (char)*plVar13 + (char)uVar3;
                  }
                  else {
                    *(char *)plVar13 = (char)*plVar13 + '\x0f';
                    uVar5 = uVar3 - 0xf;
                    if (0x1fd < uVar5) {
                      uVar5 = uVar3 - 0x20d;
                      uVar1 = (uVar5 / 0x1fe) * 2;
                      memset(plVar18,0xff,(ulong)((uVar5 / 0x1fe) * 2 + 2));
                      uVar5 = (uVar1 + (uVar5 / 0x1fe) * -0x200 + uVar3) - 0x20d;
                      plVar18 = (long *)((long)plVar11 + (ulong)uVar1 + 4);
                    }
                    if (0xfe < uVar5) {
                      uVar5 = uVar5 - 0xff;
                      *(char *)plVar18 = -1;
                      plVar18 = (long *)((long)plVar18 + 1);
                    }
                    *(char *)plVar18 = (char)uVar5;
                    plVar18 = (long *)((long)plVar18 + 1);
                  }
                }
                iVar4 = 1;
                plVar10 = (long *)((long)plVar10 + (ulong)(uVar3 + 4));
                plVar11 = plVar18;
                if (pcVar16 < pcVar17) goto LAB_001521c1;
                local_40a8 = plVar10;
                if (source + (long)inputSize + -0xc < plVar10) {
                  iVar4 = 4;
                  goto LAB_001521c1;
                }
                *(short *)((long)local_4050 +
                          (ulong)((uint)((ulong)(*(long *)((long)plVar10 + -2) * 0xcf1bbcdcbb) >>
                                        0x1b) & 0x1fff) * 2) = ((short)plVar10 + -2) - sVar2;
                uVar14 = (ulong)((uint)((ulong)(*plVar10 * 0xcf1bbcdcbb) >> 0x1b) & 0x1fff);
                uVar12 = (ulong)*(ushort *)((long)local_4050 + uVar14 * 2);
                piVar19 = (int *)(source + uVar12);
                *(short *)((long)local_4050 + uVar14 * 2) = (short)plVar10 - sVar2;
                if ((source + uVar12 + 0xffff < plVar10) || (*piVar19 != (int)*plVar10)) break;
                plVar11 = (long *)((long)plVar18 + 1);
                *(char *)plVar18 = '\0';
                plVar13 = plVar18;
              }
              uVar15 = (uint)((ulong)(*(long *)((long)plVar10 + 1) * 0xcf1bbcdcbb) >> 0x1b) & 0x1fff
              ;
              iVar4 = 0;
              plVar10 = (long *)((long)plVar10 + 1);
            }
          }
LAB_001521c1:
          plVar13 = plVar11;
        } while (iVar4 == 0);
        if (1 < iVar4 - 3U) {
          return 0;
        }
      }
      iVar4 = 0;
      pcVar17 = source + ((long)inputSize - (long)local_40a8);
      pcVar16 = (char *)((long)plVar11 +
                        (long)(pcVar17 + ((ulong)(pcVar17 + 0xf0) / 0xff - (long)dest) + 1));
      if (pcVar16 <= (char *)(ulong)(uint)maxOutputSize) {
        if (pcVar17 < (char *)0xf) {
          *(char *)plVar11 = (char)pcVar17 << 4;
        }
        else {
          pcVar9 = pcVar17 + -0xf;
          *(char *)plVar11 = -0x10;
          plVar10 = (long *)((long)plVar11 + 1);
          if ((char *)0xfe < pcVar9) {
            uVar14 = (ulong)(pcVar17 + -0x10e) / 0xff;
            memset(plVar10,0xff,uVar14 + 1);
            plVar10 = (long *)((long)plVar11 + uVar14 + 2);
            pcVar9 = pcVar17 + uVar14 * -0xff + -0x10e;
          }
          *(char *)plVar10 = (char)pcVar9;
          plVar11 = plVar10;
        }
        memcpy((char *)((long)plVar11 + 1),local_40a8,(size_t)pcVar17);
        plVar11 = (long *)((long)plVar11 + (long)(pcVar17 + 1));
      }
      if (pcVar16 <= (char *)(ulong)(uint)maxOutputSize) {
        iVar4 = (int)plVar11 - (int)dest;
      }
    }
  }
  else if ((uint)inputSize < 0x7e000001) {
    local_4050[(uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff] = 0;
    plVar11 = (long *)(source + 1);
    uVar15 = (uint)((ulong)(*(long *)(source + 1) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
    plVar10 = (long *)dest;
    piVar19 = (int *)dest;
    local_40a0 = (long *)source;
    do {
      uVar14 = 1;
      uVar3 = uVar15;
      uVar5 = acceleration << 6;
      while( true ) {
        plVar13 = (long *)(uVar14 + (long)plVar11);
        iVar4 = (int)source;
        if (source + ((ulong)(uint)inputSize - 0xc) < plVar13) break;
        piVar19 = (int *)(source + local_4050[uVar3]);
        uVar15 = (uint)((ulong)(*plVar13 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
        local_4050[uVar3] = (int)plVar11 - iVar4;
        if ((plVar11 <= (long *)((long)piVar19 + 0xffffU)) && (*piVar19 == (int)*plVar11)) {
          iVar6 = 0;
          goto LAB_0015238a;
        }
        uVar14 = (ulong)(uVar5 >> 6);
        uVar5 = uVar5 + 1;
        plVar11 = plVar13;
        uVar3 = uVar15;
      }
      iVar6 = 3;
      uVar15 = uVar3;
LAB_0015238a:
      plVar13 = plVar10;
      if (iVar6 == 0) {
        if ((local_40a0 < plVar11) && (source < piVar19)) {
          while( true ) {
            plVar13 = (long *)((long)plVar11 + -1);
            piVar7 = (int *)((long)piVar19 + -1);
            if (*(char *)plVar13 != *(char *)piVar7) break;
            plVar11 = plVar13;
            piVar19 = piVar7;
            if ((plVar13 <= local_40a0) || (piVar7 <= source)) break;
          }
        }
        uVar14 = (long)plVar11 - (long)local_40a0;
        plVar13 = (long *)((long)plVar10 + 1);
        uVar12 = uVar14 & 0xffffffff;
        pcVar17 = (char *)((long)plVar10 + uVar12 / 0xff + uVar12 + 9);
        if (pcVar17 <= pcVar16) {
          if ((uint)uVar14 < 0xf) {
            *(char *)plVar10 = (char)uVar14 << 4;
            plVar18 = plVar13;
          }
          else {
            iVar6 = (uint)uVar14 - 0xf;
            *(char *)plVar10 = -0x10;
            if (0xfe < iVar6) {
              if (0x1fc < iVar6) {
                iVar6 = 0x1fd;
              }
              uVar3 = ((int)plVar11 - (iVar6 + (int)local_40a0)) + 0xef;
              memset(plVar13,0xff,(ulong)(uVar3 / 0xff + 1));
              plVar13 = (long *)((long)plVar10 + (ulong)uVar3 / 0xff + 2);
              iVar6 = ((int)plVar11 - (int)local_40a0) + uVar3 / 0xff + -0x10e;
            }
            *(char *)plVar13 = (char)iVar6;
            plVar18 = (long *)((long)plVar13 + 1);
          }
          plVar13 = (long *)(uVar12 + (long)plVar18);
          plVar8 = local_40a0;
          do {
            *plVar18 = *plVar8;
            plVar18 = plVar18 + 1;
            plVar8 = plVar8 + 1;
          } while (plVar18 < plVar13);
        }
        iVar6 = 1;
        if (pcVar17 <= pcVar16) {
          while( true ) {
            *(short *)plVar13 = (short)plVar11 - (short)piVar19;
            plVar18 = (long *)((long)plVar13 + 2);
            uVar3 = LZ4_count((BYTE *)((long)plVar11 + 4),(BYTE *)(piVar19 + 1),
                              (BYTE *)(source + ((ulong)(uint)inputSize - 5)));
            pcVar17 = (char *)((long)plVar13 + (ulong)(uVar3 >> 8) + 8);
            if (pcVar17 <= pcVar16) {
              if (uVar3 < 0xf) {
                *(char *)plVar10 = (char)*plVar10 + (char)uVar3;
              }
              else {
                *(char *)plVar10 = (char)*plVar10 + '\x0f';
                uVar5 = uVar3 - 0xf;
                if (0x1fd < uVar5) {
                  uVar5 = uVar3 - 0x20d;
                  uVar1 = (uVar5 / 0x1fe) * 2;
                  memset(plVar18,0xff,(ulong)((uVar5 / 0x1fe) * 2 + 2));
                  uVar5 = (uVar1 + (uVar5 / 0x1fe) * -0x200 + uVar3) - 0x20d;
                  plVar18 = (long *)((long)plVar13 + (ulong)uVar1 + 4);
                }
                if (0xfe < uVar5) {
                  uVar5 = uVar5 - 0xff;
                  *(char *)plVar18 = -1;
                  plVar18 = (long *)((long)plVar18 + 1);
                }
                *(char *)plVar18 = (char)uVar5;
                plVar18 = (long *)((long)plVar18 + 1);
              }
            }
            plVar11 = (long *)((long)plVar11 + (ulong)(uVar3 + 4));
            plVar13 = plVar18;
            if (pcVar16 < pcVar17) goto LAB_001526b4;
            local_40a0 = plVar11;
            if (source + ((ulong)(uint)inputSize - 0xc) < plVar11) {
              iVar6 = 4;
              goto LAB_001526b4;
            }
            local_4050
            [(uint)((ulong)(*(long *)((long)plVar11 + -2) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff] =
                 ((int)plVar11 + -2) - iVar4;
            uVar5 = (uint)((ulong)(*plVar11 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
            uVar3 = local_4050[uVar5];
            piVar19 = (int *)(source + uVar3);
            local_4050[uVar5] = (int)plVar11 - iVar4;
            if ((source + (ulong)uVar3 + 0xffff < plVar11) || (*piVar19 != (int)*plVar11)) break;
            plVar13 = (long *)((long)plVar18 + 1);
            *(char *)plVar18 = '\0';
            plVar10 = plVar18;
          }
          uVar15 = (uint)((ulong)(*(long *)((long)plVar11 + 1) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff;
          iVar6 = 0;
          plVar11 = (long *)((long)plVar11 + 1);
        }
      }
LAB_001526b4:
      plVar10 = plVar13;
    } while (iVar6 == 0);
    iVar4 = 0;
    if (iVar6 - 3U < 2) {
      pcVar16 = source + ((ulong)(uint)inputSize - (long)local_40a0);
      pcVar17 = (char *)((long)plVar13 +
                        (long)(pcVar16 + ((ulong)(pcVar16 + 0xf0) / 0xff - (long)dest) + 1));
      if (pcVar17 <= (char *)(ulong)(uint)maxOutputSize) {
        if (pcVar16 < (char *)0xf) {
          *(char *)plVar13 = (char)pcVar16 << 4;
        }
        else {
          pcVar9 = pcVar16 + -0xf;
          *(char *)plVar13 = -0x10;
          plVar11 = (long *)((long)plVar13 + 1);
          if ((char *)0xfe < pcVar9) {
            uVar14 = (ulong)(pcVar16 + -0x10e) / 0xff;
            memset(plVar11,0xff,uVar14 + 1);
            plVar11 = (long *)((long)plVar13 + uVar14 + 2);
            pcVar9 = pcVar16 + uVar14 * -0xff + -0x10e;
          }
          *(char *)plVar11 = (char)pcVar9;
          plVar13 = plVar11;
        }
        memcpy((char *)((long)plVar13 + 1),local_40a0,(size_t)pcVar16);
        plVar13 = (long *)((long)plVar13 + (long)(pcVar16 + 1));
      }
      if (pcVar17 <= (char *)(ulong)(uint)maxOutputSize) {
        iVar4 = (int)plVar13 - (int)dest;
      }
    }
  }
  return iVar4;
}

Assistant:

int LZ4_compress_fast_force(const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t ctx;

    LZ4_resetStream(&ctx);

    if (inputSize < LZ4_64Klimit)
        return LZ4_compress_generic(&ctx, source, dest, inputSize, maxOutputSize, limitedOutput, byU16,                        noDict, noDictIssue, acceleration);
    else
        return LZ4_compress_generic(&ctx, source, dest, inputSize, maxOutputSize, limitedOutput, LZ4_64bits() ? byU32 : byPtr, noDict, noDictIssue, acceleration);
}